

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaB_pairs(lua_State *L)

{
  lua_State *in_RDI;
  int in_stack_0000000c;
  lua_State *in_stack_00000010;
  
  luaL_checktype(L,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  lua_pushvalue(in_stack_00000010,in_stack_0000000c);
  lua_pushvalue(in_stack_00000010,in_stack_0000000c);
  lua_pushnil(in_RDI);
  return 3;
}

Assistant:

static int luaB_pairs(lua_State*L){
luaL_checktype(L,1,5);
lua_pushvalue(L,lua_upvalueindex(1));
lua_pushvalue(L,1);
lua_pushnil(L);
return 3;
}